

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

int mbedtls_mpi_core_write_le(mbedtls_mpi_uint *A,size_t A_limbs,uchar *output,size_t output_length)

{
  ulong uVar1;
  ulong local_50;
  size_t i_1;
  size_t i;
  size_t bytes_to_copy;
  size_t stored_bytes;
  size_t output_length_local;
  uchar *output_local;
  size_t A_limbs_local;
  mbedtls_mpi_uint *A_local;
  
  uVar1 = A_limbs * 8;
  i_1 = output_length;
  i = uVar1;
  if (output_length <= uVar1) {
    for (; i = output_length, i_1 < uVar1; i_1 = i_1 + 1) {
      if ((*(ulong *)((long)A + (i_1 & 0xfffffffffffffff8)) >> (sbyte)((i_1 & 7) << 3) & 0xff) != 0)
      {
        return -8;
      }
    }
  }
  for (local_50 = 0; local_50 < i; local_50 = local_50 + 1) {
    output[local_50] =
         (uchar)(*(ulong *)((long)A + (local_50 & 0xfffffffffffffff8)) >>
                (sbyte)((local_50 & 7) << 3));
  }
  if (uVar1 < output_length) {
    memset(output + uVar1,0,output_length + A_limbs * -8);
  }
  return 0;
}

Assistant:

int mbedtls_mpi_core_write_le(const mbedtls_mpi_uint *A,
                              size_t A_limbs,
                              unsigned char *output,
                              size_t output_length)
{
    size_t stored_bytes = A_limbs * ciL;
    size_t bytes_to_copy;

    if (stored_bytes < output_length) {
        bytes_to_copy = stored_bytes;
    } else {
        bytes_to_copy = output_length;

        /* The output buffer is smaller than the allocated size of A.
         * However A may fit if its leading bytes are zero. */
        for (size_t i = bytes_to_copy; i < stored_bytes; i++) {
            if (GET_BYTE(A, i) != 0) {
                return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
            }
        }
    }

    for (size_t i = 0; i < bytes_to_copy; i++) {
        output[i] = GET_BYTE(A, i);
    }

    if (stored_bytes < output_length) {
        /* Write trailing 0 bytes */
        memset(output + stored_bytes, 0, output_length - stored_bytes);
    }

    return 0;
}